

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O0

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::generateError
          (Lexer *this,
          unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
          *err)

{
  value_type *in_RDX;
  bool bVar1;
  Position local_40;
  undefined1 local_22 [10];
  unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
  *err_local;
  Lexer *this_local;
  
  err_local = err;
  this_local = this;
  std::
  vector<std::unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>,_std::allocator<std::unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>_>_>
  ::push_back((vector<std::unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>,_std::allocator<std::unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>_>_>
               *)(err + 0x11),in_RDX);
  while( true ) {
    bVar1 = false;
    if ((*(int *)&err[0x16]._M_t.
                  super___uniq_ptr_impl<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_pfederc::Error<pfederc::LexerErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                  .super__Head_base<0UL,_pfederc::Error<pfederc::LexerErrorCode>_*,_false>.
                  _M_head_impl != -1) &&
       (bVar1 = false,
       *(int *)&err[0x16]._M_t.
                super___uniq_ptr_impl<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_pfederc::Error<pfederc::LexerErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                .super__Head_base<0UL,_pfederc::Error<pfederc::LexerErrorCode>_*,_false>.
                _M_head_impl != 10)) {
      bVar1 = *(int *)&err[0x16]._M_t.
                       super___uniq_ptr_impl<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_pfederc::Error<pfederc::LexerErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                       .super__Head_base<0UL,_pfederc::Error<pfederc::LexerErrorCode>_*,_false>.
                       _M_head_impl != 0xd;
    }
    if (!bVar1) break;
    nextChar((Lexer *)err);
  }
  local_22._0_2_ = 0;
  getCurrentCursor(&local_40,(Lexer *)err);
  std::make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType,pfederc::Position>
            ((Token **)this,(TokenType *)(err + 0x17),(Position *)local_22);
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::generateError(std::unique_ptr<LexerError> &&err) noexcept {
  errors.push_back(std::move(err));
  while (currentChar != EOF
      && currentChar != '\n' && currentChar != '\r')
    nextChar();
  return std::make_unique<Token>(currentToken, TokenType::TOK_ERR, getCurrentCursor());
}